

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReader.h
# Opt level: O2

void __thiscall ReaderData::~ReaderData(ReaderData *this)

{
  this->_vptr_ReaderData = (_func_int **)&PTR__ReaderData_00249fb0;
  if (this->m_nextBlock[0] != (uint8_t *)0x0) {
    operator_delete__(this->m_nextBlock[0]);
  }
  if (this->m_nextBlock[1] != (uint8_t *)0x0) {
    operator_delete__(this->m_nextBlock[1]);
  }
  std::__cxx11::string::~string((string *)&this->m_streamName);
  return;
}

Assistant:

virtual ~ReaderData()
    {
        // deleteNextBlocks();
        delete[] m_nextBlock[0];
        delete[] m_nextBlock[1];
    }